

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_parse.c
# Opt level: O0

BCReg expr_toanyreg(FuncState *fs,ExpDesc *e)

{
  ExpDesc *in_RSI;
  FuncState *in_RDI;
  undefined4 in_stack_fffffffffffffff8;
  undefined4 in_stack_fffffffffffffffc;
  
  expr_discharge(in_RDI,in_RSI);
  if (in_RSI->k == VNONRELOC) {
    if (in_RSI->t == in_RSI->f) {
      return (in_RSI->u).s.info;
    }
    if (in_RDI->nactvar <= (in_RSI->u).s.info) {
      expr_toreg((FuncState *)e,
                 (ExpDesc *)CONCAT44(in_stack_fffffffffffffffc,in_stack_fffffffffffffff8),
                 (BCReg)((ulong)in_RDI >> 0x20));
      return (in_RSI->u).s.info;
    }
  }
  expr_tonextreg(in_RDI,in_RSI);
  return (in_RSI->u).s.info;
}

Assistant:

static BCReg expr_toanyreg(FuncState *fs, ExpDesc *e)
{
  expr_discharge(fs, e);
  if (e->k == VNONRELOC) {
    if (!expr_hasjump(e)) return e->u.s.info;  /* Already in a register. */
    if (e->u.s.info >= fs->nactvar) {
      expr_toreg(fs, e, e->u.s.info);  /* Discharge to temp. register. */
      return e->u.s.info;
    }
  }
  expr_tonextreg(fs, e);  /* Discharge to next register. */
  return e->u.s.info;
}